

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O2

void __thiscall
wasm::ChildLocalizer::ChildLocalizer
          (ChildLocalizer *this,Expression *input,Function *func,Module *wasm,PassOptions *options)

{
  Expression *value;
  uintptr_t uVar1;
  bool bVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  Expression ***pppEVar5;
  LocalGet *pLVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 local_b8 [8];
  ChildIterator iterator;
  undefined1 auStack_68 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> effects;
  Builder local_48;
  Builder builder;
  LocalSet *local_38;
  Expression *child;
  
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.wasm = wasm;
  builder.wasm = (Module *)this;
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
            ((AbstractChildIterator<wasm::ChildIterator> *)local_b8,input);
  uVar9 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start -
           (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                 [3] >> 3) + (long)local_b8;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (uVar7 = 0; uVar7 < uVar9; uVar7 = uVar7 + 1) {
    uVar3 = ~(ulong)uVar7 + uVar9;
    pppEVar5 = (Expression ***)
               (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3]
               + (uVar3 - 4));
    if (uVar3 < 4) {
      pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems +
                 (uVar3 - 1);
    }
    local_38 = (LocalSet *)**pppEVar5;
    std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
    emplace_back<wasm::PassOptions_const&,wasm::Module&,wasm::Expression*&>
              ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)auStack_68,
               options,wasm,(Expression **)&local_38);
  }
  for (uVar7 = 0; uVar3 = (ulong)uVar7, uVar3 < uVar9; uVar7 = uVar7 + 1) {
    uVar4 = ~uVar3 + uVar9;
    pppEVar5 = (Expression ***)
               (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3]
               + (uVar4 - 4));
    if (uVar4 < 4) {
      pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems +
                 (uVar4 - 1);
    }
    value = **pppEVar5;
    if ((value->type).id == 1) break;
    iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pppEVar5;
    bVar2 = EffectAnalyzer::hasUnremovableSideEffects
                      ((EffectAnalyzer *)((long)auStack_68 + uVar3 * 0x170));
    if (bVar2) {
LAB_00858b03:
      index = Builder::addVar(func,(Type)(value->type).id);
      local_38 = Builder::makeLocalSet(&local_48,index,value);
      std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::emplace_back<wasm::LocalSet*>
                ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)builder.wasm,&local_38);
      uVar1 = (value->type).id;
      pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_48.wasm)->allocator);
      pLVar6->index = index;
      (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
      *iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (Expression **)pLVar6;
    }
    else {
      for (uVar8 = 0; uVar8 < uVar9; uVar8 = uVar8 + 1) {
        if (uVar7 != uVar8) {
          bVar2 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)((long)auStack_68 + uVar3 * 0x170),
                             (EffectAnalyzer *)((long)auStack_68 + (ulong)uVar8 * 0x170));
          if (bVar2) goto LAB_00858b03;
        }
      }
    }
  }
  std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
            ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_68);
  std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
             (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems + 3)
            );
  return;
}

Assistant:

ChildLocalizer(Expression* input,
                 Function* func,
                 Module* wasm,
                 const PassOptions& options) {
    Builder builder(*wasm);
    ChildIterator iterator(input);
    auto& children = iterator.children;
    auto num = children.size();

    // Compute the effects of all children.
    std::vector<EffectAnalyzer> effects;
    for (Index i = 0; i < num; i++) {
      // The children are in reverse order in ChildIterator, but we want to
      // process them in the normal order.
      auto* child = *children[num - 1 - i];
      effects.emplace_back(options, *wasm, child);
    }

    // Go through the children and move to locals those that we need to.
    for (Index i = 0; i < num; i++) {
      auto** childp = children[num - 1 - i];
      auto* child = *childp;
      if (child->type == Type::unreachable) {
        break;
      }

      // Use a local if we need to. That is the case either if this has side
      // effects we can't remove, or if it interacts with other children.
      bool needLocal = effects[i].hasUnremovableSideEffects();
      if (!needLocal) {
        for (Index j = 0; j < num; j++) {
          if (j != i && effects[i].invalidates(effects[j])) {
            needLocal = true;
            break;
          }
        }
      }
      if (needLocal) {
        auto local = builder.addVar(func, child->type);
        sets.push_back(builder.makeLocalSet(local, child));
        *childp = builder.makeLocalGet(local, child->type);
      }
    }
  }